

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_constants.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::MoveConstantsRule::Apply
          (MoveConstantsRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  bool bVar2;
  ExpressionType EVar3;
  int iVar4;
  reference pvVar5;
  BoundComparisonExpression *pBVar6;
  BoundConstantExpression *pBVar7;
  BoundFunctionExpression *pBVar8;
  BoundConstantExpression *pBVar9;
  reference pvVar10;
  bool *pbVar11;
  string *psVar12;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var13;
  undefined7 in_register_00000081;
  undefined1 *puVar14;
  hugeint_t hVar15;
  hugeint_t value;
  hugeint_t rhs;
  hugeint_t value_00;
  hugeint_t rhs_00;
  hugeint_t value_01;
  hugeint_t value_02;
  hugeint_t inner_value;
  Value result_value;
  hugeint_t outer_value;
  hugeint_t local_290;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_280;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_278;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_270;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_268;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_260;
  Value *local_258;
  ulong local_250;
  LogicalType *local_248;
  undefined1 *local_240;
  Value local_238;
  Value local_1f8;
  LogicalType local_1b8;
  Value local_1a0;
  Value local_160;
  hugeint_t local_120;
  hugeint_t local_110;
  hugeint_t local_100;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  pbVar11 = changes_made;
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar6 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                     (&pvVar5->_M_data->super_BaseExpression);
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  pBVar7 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar5->_M_data->super_BaseExpression);
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  pBVar8 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&pvVar5->_M_data->super_BaseExpression);
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,3);
  pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar5->_M_data->super_BaseExpression);
  if ((((LogicalType *)&(pBVar9->value).is_null)->id_ != '\0') ||
     (((LogicalType *)&(pBVar7->value).is_null)->id_ == '\x01')) {
    EVar3 = (pBVar6->super_Expression).super_BaseExpression.type;
    if ((EVar3 != COMPARE_BOUNDARY_END) && (EVar3 != COMPARE_DISTINCT_FROM)) {
      LogicalType::LogicalType(&local_1b8,&(pBVar6->super_Expression).return_type);
      Value::Value(&local_1f8,&local_1b8);
      pBVar7 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value(&local_238,&local_1f8);
      BoundConstantExpression::BoundConstantExpression(pBVar7,&local_238);
      Value::~Value(&local_238);
      (this->super_Rule)._vptr_Rule = (_func_int **)pBVar7;
      Value::~Value(&local_1f8);
      LogicalType::~LogicalType(&local_1b8);
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
    }
    goto LAB_006877e9;
  }
  local_258 = &pBVar7->value;
  local_248 = &(pBVar7->super_Expression).return_type;
  local_240 = (undefined1 *)CONCAT71(in_register_00000081,is_root);
  local_1f8.type_._0_16_ = IntegralValue::Get(local_258);
  local_290 = IntegralValue::Get(&pBVar9->value);
  this_00 = &pBVar8->children;
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](this_00,0);
  _Var1._M_head_impl =
       (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  local_250 = (ulong)((BoundConstantExpression *)_Var1._M_head_impl == pBVar9);
  psVar12 = &(pBVar8->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  iVar4 = ::std::__cxx11::string::compare((char *)psVar12);
  if (iVar4 == 0) {
    hVar15.upper = (int64_t)pbVar11;
    hVar15.lower = local_290.upper;
    bVar2 = Hugeint::TrySubtractInPlace((Hugeint *)&local_1f8,(hugeint_t *)local_290.lower,hVar15);
    if (!bVar2) goto LAB_006877e9;
    value.upper = (int64_t)pbVar11;
    value.lower = (uint64_t)
                  local_1f8.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    Value::HUGEINT(&local_238,(Value *)local_1f8.type_._0_8_,value);
    bVar2 = Value::DefaultTryCastAs(&local_238,local_248,false);
    puVar14 = local_240;
    if (!bVar2) {
      if ((pBVar6->super_Expression).super_BaseExpression.type != COMPARE_BOUNDARY_START)
      goto LAB_00687dd6;
      pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](this_00,local_250);
      local_260._M_head_impl =
           (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      Value::BOOLEAN(&local_70,false);
      ExpressionRewriter::ConstantOrNull
                ((ExpressionRewriter *)this,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_260,&local_70);
      Value::~Value(&local_70);
      if (local_260._M_head_impl != (Expression *)0x0) {
        (*((local_260._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_260._M_head_impl = (Expression *)0x0;
      goto LAB_00687ddd;
    }
LAB_00687ce9:
    Value::operator=(local_258,&local_238);
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)psVar12);
    if (iVar4 != 0) {
      hugeint_t::hugeint_t((hugeint_t *)&local_238,0);
      bVar2 = hugeint_t::operator==(&local_290,(hugeint_t *)&local_238);
      if (bVar2) goto LAB_006877e9;
      local_238.type_.id_ = INVALID;
      local_238.type_.physical_type_ = ~INVALID;
      local_238.type_._2_6_ = 0;
      local_238.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x8000000000000000;
      bVar2 = hugeint_t::operator==((hugeint_t *)&local_1f8,(hugeint_t *)&local_238);
      if (bVar2) {
        hugeint_t::hugeint_t(&local_100,-1);
        bVar2 = hugeint_t::operator==(&local_290,&local_100);
        if (!bVar2) goto LAB_00687907;
      }
      else {
LAB_00687907:
        local_110 = hugeint_t::operator%((hugeint_t *)&local_1f8,&local_290);
        hugeint_t::hugeint_t(&local_120,0);
        bVar2 = hugeint_t::operator!=(&local_110,&local_120);
        if (!bVar2) {
          hugeint_t::hugeint_t((hugeint_t *)&local_238,0);
          bVar2 = hugeint_t::operator<(&local_290,(hugeint_t *)&local_238);
          if (bVar2) {
            EVar3 = FlipComparisonExpression((pBVar6->super_Expression).super_BaseExpression.type);
            (pBVar6->super_Expression).super_BaseExpression.type = EVar3;
          }
          hVar15 = hugeint_t::operator/((hugeint_t *)&local_1f8,&local_290);
          value_02.lower = hVar15.upper;
          value_02.upper = (int64_t)pbVar11;
          Value::HUGEINT(&local_238,(Value *)hVar15.lower,value_02);
          bVar2 = Value::DefaultTryCastAs(&local_238,local_248,false);
          puVar14 = local_240;
          if (bVar2) goto LAB_00687ce9;
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](this_00,local_250);
          local_280._M_head_impl =
               (pvVar10->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          Value::BOOLEAN(&local_1a0,false);
          ExpressionRewriter::ConstantOrNull
                    ((ExpressionRewriter *)this,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_280,&local_1a0);
          Value::~Value(&local_1a0);
          if (local_280._M_head_impl != (Expression *)0x0) {
            (*((local_280._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_280._M_head_impl = (Expression *)0x0;
          goto LAB_00687ddd;
        }
      }
      EVar3 = (pBVar6->super_Expression).super_BaseExpression.type;
      if ((byte)(EVar3 - COMPARE_BOUNDARY_START) < 2) {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](this_00,local_250);
        local_278._M_head_impl =
             (pvVar10->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        Value::BOOLEAN(&local_160,EVar3 == COMPARE_NOTEQUAL);
        ExpressionRewriter::ConstantOrNull
                  ((ExpressionRewriter *)this,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_278,&local_160);
        Value::~Value(&local_160);
        if (local_278._M_head_impl == (Expression *)0x0) {
          return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this
          ;
        }
        (*((local_278._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
      }
      goto LAB_006877e9;
    }
    if ((BoundConstantExpression *)_Var1._M_head_impl == pBVar9) {
      rhs_00.upper = (int64_t)pbVar11;
      rhs_00.lower = (uint64_t)
                     local_1f8.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      bVar2 = Hugeint::TrySubtractInPlace
                        ((Hugeint *)&local_290,(hugeint_t *)local_1f8.type_._0_8_,rhs_00);
      puVar14 = local_240;
      if (!bVar2) goto LAB_006877e9;
      value_01.upper = (int64_t)pbVar11;
      value_01.lower = local_290.upper;
      Value::HUGEINT(&local_238,(Value *)local_290.lower,value_01);
      bVar2 = Value::DefaultTryCastAs(&local_238,local_248,false);
      if (bVar2) {
        Value::operator=(local_258,&local_238);
        EVar3 = FlipComparisonExpression((pBVar6->super_Expression).super_BaseExpression.type);
        (pBVar6->super_Expression).super_BaseExpression.type = EVar3;
      }
      else {
        if ((pBVar6->super_Expression).super_BaseExpression.type != COMPARE_BOUNDARY_START)
        goto LAB_00687dd6;
        pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](this_00,1);
        local_270._M_head_impl =
             (pvVar10->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        Value::BOOLEAN(&local_f0,false);
        ExpressionRewriter::ConstantOrNull
                  ((ExpressionRewriter *)this,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_270,&local_f0);
        Value::~Value(&local_f0);
        if (local_270._M_head_impl != (Expression *)0x0) {
          (*((local_270._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_270._M_head_impl = (Expression *)0x0;
      }
    }
    else {
      rhs.upper = (int64_t)pbVar11;
      rhs.lower = local_290.upper;
      bVar2 = Hugeint::TryAddInPlace((Hugeint *)&local_1f8,(hugeint_t *)local_290.lower,rhs);
      puVar14 = local_240;
      if (!bVar2) goto LAB_006877e9;
      value_00.upper = (int64_t)pbVar11;
      value_00.lower =
           (uint64_t)
           local_1f8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      Value::HUGEINT(&local_238,(Value *)local_1f8.type_._0_8_,value_00);
      bVar2 = Value::DefaultTryCastAs(&local_238,local_248,false);
      if (bVar2) goto LAB_00687ce9;
      if ((pBVar6->super_Expression).super_BaseExpression.type == COMPARE_BOUNDARY_START) {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](this_00,0);
        local_268._M_head_impl =
             (pvVar10->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        Value::BOOLEAN(&local_b0,false);
        ExpressionRewriter::ConstantOrNull
                  ((ExpressionRewriter *)this,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_268,&local_b0);
        Value::~Value(&local_b0);
        if (local_268._M_head_impl != (Expression *)0x0) {
          (*((local_268._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_268._M_head_impl = (Expression *)0x0;
      }
      else {
LAB_00687dd6:
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
      }
    }
  }
LAB_00687ddd:
  Value::~Value(&local_238);
  if (bVar2 == false) {
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](this_00,local_250);
  _Var1._M_head_impl =
       (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  _Var13._M_head_impl =
       (pBVar6->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if ((BoundConstantExpression *)_Var13._M_head_impl == pBVar7) {
    _Var13._M_head_impl =
         (pBVar6->right).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar6->right).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var1._M_head_impl;
  }
  else {
    (pBVar6->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var1._M_head_impl;
  }
  if (_Var13._M_head_impl != (Expression *)0x0) {
    (**(code **)((long)((_Var13._M_head_impl)->super_BaseExpression)._vptr_BaseExpression + 8))();
  }
  *puVar14 = 1;
LAB_006877e9:
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> MoveConstantsRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                bool &changes_made, bool is_root) {
	auto &comparison = bindings[0].get().Cast<BoundComparisonExpression>();
	auto &outer_constant = bindings[1].get().Cast<BoundConstantExpression>();
	auto &arithmetic = bindings[2].get().Cast<BoundFunctionExpression>();
	auto &inner_constant = bindings[3].get().Cast<BoundConstantExpression>();
	D_ASSERT(arithmetic.return_type.IsIntegral());
	D_ASSERT(arithmetic.children[0]->return_type.IsIntegral());
	if (inner_constant.value.IsNull() || outer_constant.value.IsNull()) {
		if (comparison.GetExpressionType() == ExpressionType::COMPARE_DISTINCT_FROM ||
		    comparison.GetExpressionType() == ExpressionType::COMPARE_NOT_DISTINCT_FROM) {
			return nullptr;
		}
		return make_uniq<BoundConstantExpression>(Value(comparison.return_type));
	}
	auto &constant_type = outer_constant.return_type;
	hugeint_t outer_value = IntegralValue::Get(outer_constant.value);
	hugeint_t inner_value = IntegralValue::Get(inner_constant.value);

	idx_t arithmetic_child_index = arithmetic.children[0].get() == &inner_constant ? 1 : 0;
	auto &op_type = arithmetic.function.name;
	if (op_type == "+") {
		// [x + 1 COMP 10] OR [1 + x COMP 10]
		// order does not matter in addition:
		// simply change right side to 10-1 (outer_constant - inner_constant)
		if (!Hugeint::TrySubtractInPlace(outer_value, inner_value)) {
			return nullptr;
		}
		auto result_value = Value::HUGEINT(outer_value);
		if (!result_value.DefaultTryCastAs(constant_type)) {
			if (comparison.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
				return nullptr;
			}
			// if the cast is not possible then the comparison is not possible
			// for example, if we have x + 5 = 3, where x is an unsigned number, we will get x = -2
			// since this is not possible we can remove the entire branch here
			return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
			                                          Value::BOOLEAN(false));
		}
		outer_constant.value = std::move(result_value);
	} else if (op_type == "-") {
		// [x - 1 COMP 10] O R [1 - x COMP 10]
		// order matters in subtraction:
		if (arithmetic_child_index == 0) {
			// [x - 1 COMP 10]
			// change right side to 10+1 (outer_constant + inner_constant)
			if (!Hugeint::TryAddInPlace(outer_value, inner_value)) {
				return nullptr;
			}
			auto result_value = Value::HUGEINT(outer_value);
			if (!result_value.DefaultTryCastAs(constant_type)) {
				// if the cast is not possible then an equality comparison is not possible
				if (comparison.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
					return nullptr;
				}
				return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
				                                          Value::BOOLEAN(false));
			}
			outer_constant.value = std::move(result_value);
		} else {
			// [1 - x COMP 10]
			// change right side to 1-10=-9
			if (!Hugeint::TrySubtractInPlace(inner_value, outer_value)) {
				return nullptr;
			}
			auto result_value = Value::HUGEINT(inner_value);
			if (!result_value.DefaultTryCastAs(constant_type)) {
				// if the cast is not possible then an equality comparison is not possible
				if (comparison.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
					return nullptr;
				}
				return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
				                                          Value::BOOLEAN(false));
			}
			outer_constant.value = std::move(result_value);
			// in this case, we should also flip the comparison
			// e.g. if we have [4 - x < 2] then we should have [x > 2]
			comparison.SetExpressionTypeUnsafe(FlipComparisonExpression(comparison.GetExpressionType()));
		}
	} else {
		D_ASSERT(op_type == "*");
		// [x * 2 COMP 10] OR [2 * x COMP 10]
		// order does not matter in multiplication:
		// change right side to 10/2 (outer_constant / inner_constant)
		// but ONLY if outer_constant is cleanly divisible by the inner_constant
		if (inner_value == 0) {
			// x * 0, the result is either 0 or NULL
			// we let the arithmetic_simplification rule take care of simplifying this first
			return nullptr;
		}
		// check out of range for HUGEINT or not cleanly divisible
		// HUGEINT is not cleanly divisible when outer_value == minimum and inner value == -1. (modulo overflow)
		if ((outer_value == NumericLimits<hugeint_t>::Minimum() && inner_value == -1) ||
		    outer_value % inner_value != 0) {
			bool is_equality = comparison.GetExpressionType() == ExpressionType::COMPARE_EQUAL;
			bool is_inequality = comparison.GetExpressionType() == ExpressionType::COMPARE_NOTEQUAL;
			if (is_equality || is_inequality) {
				// we know the values are not equal
				// the result will be either FALSE or NULL (if COMPARE_EQUAL)
				// or TRUE or NULL (if COMPARE_NOTEQUAL)
				return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
				                                          Value::BOOLEAN(is_inequality));
			} else {
				// not cleanly divisible and we are doing > >= < <=, skip the simplification for now
				return nullptr;
			}
		}
		if (inner_value < 0) {
			// multiply by negative value, need to flip expression
			comparison.SetExpressionTypeUnsafe(FlipComparisonExpression(comparison.GetExpressionType()));
		}
		// else divide the RHS by the LHS
		// we need to do a range check on the cast even though we do a division
		// because e.g. -128 / -1 = 128, which is out of range
		auto result_value = Value::HUGEINT(outer_value / inner_value);
		if (!result_value.DefaultTryCastAs(constant_type)) {
			return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
			                                          Value::BOOLEAN(false));
		}
		outer_constant.value = std::move(result_value);
	}
	// replace left side with x
	// first extract x from the arithmetic expression
	auto arithmetic_child = std::move(arithmetic.children[arithmetic_child_index]);
	// then place in the comparison
	if (comparison.left.get() == &outer_constant) {
		comparison.right = std::move(arithmetic_child);
	} else {
		comparison.left = std::move(arithmetic_child);
	}
	changes_made = true;
	return nullptr;
}